

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fIntegerStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::IntegerStateQueryVerifiers::GetIntegerVerifier::verifyInteger4Mask
          (GetIntegerVerifier *this,TestContext *testCtx,GLenum name,GLint reference0,
          bool enableRef0,GLint reference1,bool enableRef1,GLint reference2,bool enableRef2,
          GLint reference3,bool enableRef3)

{
  GLenum pname;
  bool bVar1;
  qpTestResult qVar2;
  int (*paiVar3) [4];
  TestLog *this_00;
  MessageBuilder *pMVar4;
  char *local_230;
  char *local_228;
  char *local_220;
  char *local_218;
  char *local_210;
  char *local_208;
  char *local_200;
  char *local_1f8 [3];
  MessageBuilder local_1e0;
  undefined1 local_5c [8];
  StateQueryMemoryWriteGuard<int[4]> intVector4;
  bool enableRef3_local;
  bool enableRef2_local;
  bool enableRef1_local;
  GLint reference1_local;
  GLenum GStack_1c;
  bool enableRef0_local;
  GLint reference0_local;
  GLenum name_local;
  TestContext *testCtx_local;
  GetIntegerVerifier *this_local;
  
  intVector4.m_postguard[2]._3_1_ = enableRef1;
  intVector4.m_postguard[2]._2_1_ = enableRef2;
  intVector4.m_postguard[2]._1_1_ = enableRef3;
  intVector4.m_postguard[3] = reference1;
  reference1_local = reference0;
  GStack_1c = name;
  _reference0_local = testCtx;
  testCtx_local = (TestContext *)this;
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int[4]>::StateQueryMemoryWriteGuard
            ((StateQueryMemoryWriteGuard<int[4]> *)local_5c);
  pname = GStack_1c;
  paiVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_function_pointer
                      ((StateQueryMemoryWriteGuard *)local_5c);
  glu::CallLogWrapper::glGetIntegerv
            (&(this->super_StateVerifier).super_CallLogWrapper,pname,*paiVar3);
  bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int[4]>::verifyValidity
                    ((StateQueryMemoryWriteGuard<int[4]> *)local_5c,_reference0_local);
  if ((bVar1) &&
     (((((enableRef0 &&
         (paiVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                    operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_5c),
         (*paiVar3)[0] != reference1_local)) ||
        (((intVector4.m_postguard[2]._3_1_ & 1) != 0 &&
         (paiVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                    operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_5c),
         (*paiVar3)[1] != intVector4.m_postguard[3])))) ||
       (((intVector4.m_postguard[2]._2_1_ & 1) != 0 &&
        (paiVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                   operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_5c),
        (*paiVar3)[2] != reference2)))) ||
      (((intVector4.m_postguard[2]._1_1_ & 1) != 0 &&
       (paiVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                  operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_5c),
       (*paiVar3)[3] != reference3)))))) {
    this_00 = tcu::TestContext::getLog(_reference0_local);
    tcu::TestLog::operator<<(&local_1e0,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar4 = tcu::MessageBuilder::operator<<(&local_1e0,(char (*) [20])"// ERROR: expected ");
    local_1f8[0] = "(";
    if (enableRef0) {
      local_1f8[0] = "";
    }
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,local_1f8);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&reference1_local);
    local_200 = ")";
    if (enableRef0) {
      local_200 = "";
    }
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_200);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0xafd70f);
    local_208 = "(";
    if ((intVector4.m_postguard[2]._3_1_ & 1) != 0) {
      local_208 = "";
    }
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_208);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,intVector4.m_postguard + 3);
    local_210 = ")";
    if ((intVector4.m_postguard[2]._3_1_ & 1) != 0) {
      local_210 = "";
    }
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_210);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0xafd70f);
    local_218 = "(";
    if ((intVector4.m_postguard[2]._2_1_ & 1) != 0) {
      local_218 = "";
    }
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_218);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&reference2);
    local_220 = ")";
    if ((intVector4.m_postguard[2]._2_1_ & 1) != 0) {
      local_220 = "";
    }
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_220);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0xafd70f);
    local_228 = "(";
    if ((intVector4.m_postguard[2]._1_1_ & 1) != 0) {
      local_228 = "";
    }
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_228);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&reference3);
    local_230 = ")";
    if ((intVector4.m_postguard[2]._1_1_ & 1) != 0) {
      local_230 = "";
    }
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_230);
    tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1e0);
    qVar2 = tcu::TestContext::getTestResult(_reference0_local);
    if (qVar2 == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult
                (_reference0_local,QP_TEST_RESULT_FAIL,"Got invalid integer value");
    }
  }
  return;
}

Assistant:

void GetIntegerVerifier::verifyInteger4Mask (tcu::TestContext& testCtx, GLenum name, GLint reference0, bool enableRef0, GLint reference1, bool enableRef1, GLint reference2, bool enableRef2, GLint reference3, bool enableRef3)
{
	using tcu::TestLog;

	StateQueryMemoryWriteGuard<GLint[4]> intVector4;
	glGetIntegerv(name, intVector4);

	if (!intVector4.verifyValidity(testCtx))
		return;

	if ((enableRef0 && (intVector4[0] != reference0)) ||
		(enableRef1 && (intVector4[1] != reference1)) ||
		(enableRef2 && (intVector4[2] != reference2)) ||
		(enableRef3 && (intVector4[3] != reference3)))
	{
		testCtx.getLog() << TestLog::Message << "// ERROR: expected "
			<< (enableRef0?"":"(") << reference0 << (enableRef0?"":")") << ", "
			<< (enableRef1?"":"(") << reference1 << (enableRef1?"":")") << ", "
			<< (enableRef2?"":"(") << reference2 << (enableRef2?"":")") << ", "
			<< (enableRef3?"":"(") << reference3 << (enableRef3?"":")")	<< TestLog::EndMessage;


		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid integer value");
	}
}